

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_initialize_tagged(secp256k1_sha256 *hash,uchar *tag,size_t taglen)

{
  uchar local_48 [8];
  uchar buf [32];
  size_t taglen_local;
  uchar *tag_local;
  secp256k1_sha256 *hash_local;
  
  secp256k1_sha256_initialize(hash);
  secp256k1_sha256_write(hash,tag,taglen);
  secp256k1_sha256_finalize(hash,local_48);
  secp256k1_sha256_initialize(hash);
  secp256k1_sha256_write(hash,local_48,0x20);
  secp256k1_sha256_write(hash,local_48,0x20);
  return;
}

Assistant:

static void secp256k1_sha256_initialize_tagged(secp256k1_sha256 *hash, const unsigned char *tag, size_t taglen) {
    unsigned char buf[32];
    secp256k1_sha256_initialize(hash);
    secp256k1_sha256_write(hash, tag, taglen);
    secp256k1_sha256_finalize(hash, buf);

    secp256k1_sha256_initialize(hash);
    secp256k1_sha256_write(hash, buf, 32);
    secp256k1_sha256_write(hash, buf, 32);
}